

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata160.cpp
# Opt level: O1

void __thiscall
ByteData160_HexConstructorException_Test::~ByteData160_HexConstructorException_Test
          (ByteData160_HexConstructorException_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ByteData160, HexConstructorException) {
  try {
    ByteData160 byte_data = ByteData160(
        "123456789012345678901234567890123456789000");
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "ByteData160 size unmatch.");
    return;
  }
  ASSERT_TRUE(false);
}